

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall QTableViewPrivate::init(QTableViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QTableView *pQVar2;
  QWidget *parent;
  void *pvVar3;
  QTableCornerButton *pQVar4;
  long in_FS_OFFSET;
  QHeaderView *in_stack_00000010;
  QTableView *in_stack_00000018;
  QHeaderView *horizontal;
  QHeaderView *vertical;
  QTableView *q;
  undefined4 in_stack_ffffffffffffff58;
  FocusPolicy in_stack_ffffffffffffff5c;
  QWidget *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  Orientation orientation;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar5;
  Connection *this_00;
  QTableView *signal;
  QHeaderView *in_stack_ffffffffffffffe8;
  ConnectionType in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  orientation = (Orientation)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(this);
  signal = pQVar2;
  QFlags<QAbstractItemView::EditTrigger>::operator|
            ((QFlags<QAbstractItemView::EditTrigger> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff5c);
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)in_stack_ffffffffffffff60,
             (QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>)SUB84((ulong)pQVar2 >> 0x20,0))
  ;
  parent = (QWidget *)operator_new(0x28);
  QHeaderView::QHeaderView
            ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             orientation,parent);
  uVar5 = 1;
  QHeaderView::setSectionsClickable
            ((QHeaderView *)in_stack_ffffffffffffff60,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
  QHeaderView::setHighlightSections
            ((QHeaderView *)in_stack_ffffffffffffff60,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
  QTableView::setVerticalHeader(in_stack_00000018,in_stack_00000010);
  pvVar3 = operator_new(0x28);
  QHeaderView::QHeaderView
            ((QHeaderView *)CONCAT44(uVar5,in_stack_ffffffffffffff80),
             (Orientation)((ulong)pvVar3 >> 0x20),parent);
  QHeaderView::setSectionsClickable
            ((QHeaderView *)in_stack_ffffffffffffff60,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
  QHeaderView::setHighlightSections
            ((QHeaderView *)in_stack_ffffffffffffff60,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
  QTableView::setHorizontalHeader
            ((QTableView *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  (this->super_QAbstractItemViewPrivate).tabKeyNavigation = true;
  pQVar4 = (QTableCornerButton *)operator_new(0x28);
  QTableCornerButton::QTableCornerButton
            ((QTableCornerButton *)in_stack_ffffffffffffff60,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  this->cornerWidget = pQVar4;
  QWidget::setFocusPolicy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar5 = 0;
  this_00 = (Connection *)&stack0xfffffffffffffff0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QAbstractItemView::*)()>
            ((Object *)0x0,(offset_in_QAbstractButton_to_subr)signal,
             (ContextType *)QAbstractButton::clicked,(offset_in_QAbstractItemView_to_subr *)this_00,
             in_stack_fffffffffffffff0);
  QMetaObject::Connection::operator=
            ((Connection *)in_stack_ffffffffffffff60,
             (Connection *)CONCAT44(in_stack_ffffffffffffff5c,uVar5));
  QMetaObject::Connection::~Connection(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::init()
{
    Q_Q(QTableView);

    q->setEditTriggers(editTriggers|QAbstractItemView::AnyKeyPressed);

    QHeaderView *vertical = new QHeaderView(Qt::Vertical, q);
    vertical->setSectionsClickable(true);
    vertical->setHighlightSections(true);
    q->setVerticalHeader(vertical);

    QHeaderView *horizontal = new QHeaderView(Qt::Horizontal, q);
    horizontal->setSectionsClickable(true);
    horizontal->setHighlightSections(true);
    q->setHorizontalHeader(horizontal);

    tabKeyNavigation = true;

#if QT_CONFIG(abstractbutton)
    cornerWidget = new QTableCornerButton(q);
    cornerWidget->setFocusPolicy(Qt::NoFocus);
    cornerWidgetConnection = QObject::connect(
          cornerWidget, &QTableCornerButton::clicked,
          q, &QTableView::selectAll);
#endif
}